

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIDManifest.cpp
# Opt level: O2

string * anon_unknown.dwarf_152b34::randomWord
                   (string *__return_storage_ptr__,bool alphaNumeric,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *options)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  pointer pcVar4;
  string *word;
  ulong uVar5;
  int l;
  ulong uVar6;
  
  uVar5 = (long)(options->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(options->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (uVar5 == 0) {
    uVar3 = random_int(0x20);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)uVar3);
    uVar6 = 0;
    uVar5 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      if (alphaNumeric) {
        uVar3 = random_int(0x3e);
        pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
        cVar1 = (char)uVar3;
        if ((int)uVar3 < 0x1a) {
          cVar1 = cVar1 + 'A';
        }
        else if (uVar3 < 0x34) {
          cVar1 = cVar1 + 'G';
        }
        else {
          cVar1 = cVar1 + -4;
        }
      }
      else {
        iVar2 = random_int(0x100);
        cVar1 = (char)iVar2;
        pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
      }
      pcVar4[uVar6] = cVar1;
    }
  }
  else {
    iVar2 = random_int((int)(uVar5 >> 5));
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)
               ((options->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + iVar2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
randomWord (bool alphaNumeric, const std::vector<std::string>& options)
{
    if (options.size () > 0) { return options[random_int (options.size ())]; }
    else
    {
        int         length = random_int (32);
        std::string word (length, ' ');
        for (int l = 0; l < length; ++l)
        {
            if (alphaNumeric)
            {
                int index =
                    random_int (62); // 26 letters*2 for case + 10 digits
                if (index < 26) { word[l] = 'A' + index; }
                else if (index < 52) { word[l] = 'a' + (index - 26); }
                else { word[l] = '0' + (index - 52); }
            }
            else { word[l] = random_int (256); }
        }
        return word;
    }
}